

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** getgclist(GCObject *o)

{
  GCObject *o_local;
  
  switch(o->tt) {
  case '\x05':
    if (o->tt != '\x05') {
      __assert_fail("(o)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x80,"GCObject **getgclist(GCObject *)");
    }
    o_local = o + 3;
    break;
  case '\x06':
    if (o->tt != '\x06') {
      __assert_fail("(o)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x81,"GCObject **getgclist(GCObject *)");
    }
    o_local = o + 1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x85,"GCObject **getgclist(GCObject *)");
  case '\b':
    if (o->tt != '\b') {
      __assert_fail("(o)->tt == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x83,"GCObject **getgclist(GCObject *)");
    }
    o_local = (GCObject *)&o[4].tt;
    break;
  case '\t':
    if (o->tt != '\t') {
      __assert_fail("(o)->tt == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x84,"GCObject **getgclist(GCObject *)");
    }
    o_local = o + 7;
    break;
  case '&':
    if (o->tt != '&') {
      __assert_fail("(o)->tt == ((6) | ((2) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x82,"GCObject **getgclist(GCObject *)");
    }
    o_local = o + 1;
  }
  return &o_local->next;
}

Assistant:

static GCObject **getgclist (GCObject *o) {
  switch (o->tt) {
    case LUA_TTABLE: return &gco2t(o)->gclist;
    case LUA_TLCL: return &gco2lcl(o)->gclist;
    case LUA_TCCL: return &gco2ccl(o)->gclist;
    case LUA_TTHREAD: return &gco2th(o)->gclist;
    case LUA_TPROTO: return &gco2p(o)->gclist;
    default: lua_assert(0); return 0;
  }
}